

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::~IdBlock
          (IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this)

{
  IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this_local;
  
  IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::~IdBlockBase
            (&this->super_IdBlockBase<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>);
  return;
}

Assistant:

constexpr auto hasValue() const
            {
                return std::visit(overload([](Type const &)
                                            { return true; },
                                            [](Type const *)
                                            { return true; },
                                            // [](Type *)
                                            // { return true; },
                                            [](std::monostate const &)
                                            { return false; }),
                                    IdBlockBase<Type>::mVariant);
            }